

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::RelOp> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::RelOp>(RecursiveDescentParser *this)

{
  uint uVar1;
  socklen_t *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::RelOp> sVar3;
  allocator local_31;
  string local_30;
  
  std::make_shared<MyCompiler::RelOp>();
  uVar1 = in_RSI->sym - EQL;
  if (uVar1 < 6) {
    if (uVar1 < 5) {
      in_RCX = (socklen_t *)&DAT_0010b8a0;
    }
    std::__cxx11::string::assign((char *)(this->stream + 0x28));
    accept(in_RSI,in_RSI->sym,__addr,in_RCX);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,"relational operator expected",&local_31);
    except(in_RSI,EQL,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::RelOp>)
         sVar3.super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::RelOp> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<RelOp>();

    if (sym == SymbolType::EQL || sym == SymbolType::NEQ || sym == SymbolType::LSS
        || sym == SymbolType::LEQ || sym == SymbolType::GTR || sym == SymbolType::GEQ)
    {
        switch (sym)
        {
            case SymbolType::EQL:
                pResult->value = "=";
                break;
            case SymbolType::NEQ:
                pResult->value = "#";
                break;
            case SymbolType::LSS:
                pResult->value = "<";
                break;
            case SymbolType::LEQ:
                pResult->value = "<=";
                break;
            case SymbolType::GTR:
                pResult->value = ">";
                break;
            default: // case SymbolType::GEQ:
                pResult->value = ">=";
        }
        accept(sym);
    }
    else
        except(SymbolType::EQL, "relational operator expected");

    return pResult;
}